

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_export(ptls_t *tls,ptls_buffer_t *output)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  char *__s;
  uint8_t *puVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ptls_iovec_t negotiated_protocol;
  int iVar10;
  size_t len;
  size_t len_00;
  ulong uVar11;
  size_t sVar13;
  int iVar14;
  uint8_t *puVar15;
  size_t sVar12;
  
  puVar15 = (uint8_t *)tls->negotiated_protocol;
  if (puVar15 == (uint8_t *)0x0) {
    puVar15 = (uint8_t *)0x0;
    len = 0;
  }
  else {
    len = strlen((char *)puVar15);
  }
  iVar10 = 0x203;
  if (tls->state == PTLS_STATE_SERVER_POST_HANDSHAKE) {
    if (((tls->traffic_protection).enc.field_0x58 & 1) == 0) {
      __s = tls->server_name;
      iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
      if (iVar10 == 0) {
        puVar4 = output->base;
        sVar5 = output->off;
        (puVar4 + sVar5)[0] = '\0';
        (puVar4 + sVar5)[1] = '\0';
        sVar5 = output->off;
        output->off = sVar5 + 2;
        bVar2 = tls->field_0x1e8;
        iVar10 = ptls_buffer_reserve_aligned(output,1,'\0');
        if (iVar10 == 0) {
          output->base[output->off] = bVar2 & 1;
          output->off = output->off + 1;
          bVar2 = tls->field_0x1e8;
          iVar10 = ptls_buffer_reserve_aligned(output,1,'\0');
          if (iVar10 == 0) {
            output->base[output->off] = bVar2 >> 1 & 1;
            output->off = output->off + 1;
            iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
            if (iVar10 == 0) {
              puVar4 = output->base;
              sVar6 = output->off;
              (puVar4 + sVar6)[0] = '\x03';
              (puVar4 + sVar6)[1] = '\x04';
              output->off = output->off + 2;
              uVar3 = tls->cipher_suite->id;
              iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
              if (iVar10 == 0) {
                *(ushort *)(output->base + output->off) = uVar3 << 8 | uVar3 >> 8;
                output->off = output->off + 2;
                iVar10 = ptls_buffer_reserve_aligned(output,0x20,'\0');
                if (iVar10 == 0) {
                  puVar4 = output->base;
                  sVar6 = output->off;
                  uVar7 = *(undefined8 *)tls->client_random;
                  uVar8 = *(undefined8 *)(tls->client_random + 8);
                  uVar9 = *(undefined8 *)(tls->client_random + 0x18);
                  puVar1 = puVar4 + sVar6 + 0x10;
                  *(undefined8 *)puVar1 = *(undefined8 *)(tls->client_random + 0x10);
                  *(undefined8 *)(puVar1 + 8) = uVar9;
                  puVar4 = puVar4 + sVar6;
                  *(undefined8 *)puVar4 = uVar7;
                  *(undefined8 *)(puVar4 + 8) = uVar8;
                  output->off = output->off + 0x20;
                  iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
                  if (iVar10 == 0) {
                    puVar4 = output->base;
                    sVar6 = output->off;
                    (puVar4 + sVar6)[0] = '\0';
                    (puVar4 + sVar6)[1] = '\0';
                    sVar13 = output->off;
                    sVar6 = sVar13 + 2;
                    output->off = sVar6;
                    sVar12 = sVar6;
                    if (__s != (char *)0x0) {
                      len_00 = strlen(__s);
                      iVar10 = ptls_buffer__do_pushv(output,__s,len_00);
                      if (iVar10 != 0) {
                        return iVar10;
                      }
                      sVar12 = output->off;
                    }
                    uVar11 = sVar12 - sVar6;
                    iVar14 = 0x20c;
                    iVar10 = iVar14;
                    if (uVar11 < 0x10000) {
                      output->base[sVar13] = (uint8_t)(uVar11 >> 8);
                      output->base[sVar13 + 1] = (uint8_t)uVar11;
                      iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
                      if (iVar10 == 0) {
                        puVar4 = output->base;
                        sVar6 = output->off;
                        (puVar4 + sVar6)[0] = '\0';
                        (puVar4 + sVar6)[1] = '\0';
                        sVar6 = output->off;
                        output->off = sVar6 + 2;
                        iVar10 = ptls_buffer__do_pushv(output,puVar15,len);
                        if ((iVar10 == 0) &&
                           (uVar11 = output->off - (sVar6 + 2), iVar10 = iVar14, uVar11 < 0x10000))
                        {
                          output->base[sVar6] = (uint8_t)(uVar11 >> 8);
                          output->base[sVar6 + 1] = (uint8_t)uVar11;
                          iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
                          if (iVar10 == 0) {
                            puVar15 = output->base;
                            sVar6 = output->off;
                            (puVar15 + sVar6)[0] = '\0';
                            (puVar15 + sVar6)[1] = '\0';
                            sVar6 = output->off;
                            output->off = sVar6 + 2;
                            iVar10 = ptls_buffer__do_pushv
                                               (output,&(tls->traffic_protection).enc,
                                                tls->cipher_suite->hash->digest_size);
                            if (iVar10 == 0) {
                              uVar11 = (tls->traffic_protection).enc.seq;
                              iVar10 = ptls_buffer_reserve_aligned(output,8,'\0');
                              if (iVar10 == 0) {
                                *(ulong *)(output->base + output->off) =
                                     uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                     (uVar11 & 0xff0000000000) >> 0x18 |
                                     (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                                     (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
                                     uVar11 << 0x38;
                                output->off = output->off + 8;
                                iVar10 = ptls_buffer__do_pushv
                                                   (output,&tls->traffic_protection,
                                                    tls->cipher_suite->hash->digest_size);
                                if (iVar10 == 0) {
                                  uVar11 = (tls->traffic_protection).dec.seq;
                                  iVar10 = ptls_buffer_reserve_aligned(output,8,'\0');
                                  if (iVar10 == 0) {
                                    *(ulong *)(output->base + output->off) =
                                         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                         (uVar11 & 0xff0000000000) >> 0x18 |
                                         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                                         (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
                                         uVar11 << 0x38;
                                    sVar13 = output->off + 8;
                                    output->off = sVar13;
                                    uVar11 = sVar13 - (sVar6 + 2);
                                    iVar10 = iVar14;
                                    if (uVar11 < 0x10000) {
                                      output->base[sVar6] = (uint8_t)(uVar11 >> 8);
                                      output->base[sVar6 + 1] = (uint8_t)uVar11;
                                      iVar10 = ptls_buffer_reserve_aligned(output,2,'\0');
                                      if (iVar10 == 0) {
                                        puVar15 = output->base;
                                        sVar6 = output->off;
                                        (puVar15 + sVar6)[0] = '\0';
                                        (puVar15 + sVar6)[1] = '\0';
                                        sVar6 = output->off;
                                        output->off = sVar6 + 2;
                                        output->base[sVar6] = '\0';
                                        output->base[sVar6 + 1] = '\0';
                                        uVar11 = output->off - (sVar5 + 2);
                                        iVar10 = iVar14;
                                        if (uVar11 < 0x10000) {
                                          output->base[sVar5] = (uint8_t)(uVar11 >> 8);
                                          output->base[sVar5 + 1] = (uint8_t)uVar11;
                                          iVar10 = 0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      negotiated_protocol.len = len;
      negotiated_protocol.base = puVar15;
      iVar10 = export_tls12_params(output,(byte)tls->field_0x1e8 & 1,(byte)tls->field_0x1e8 >> 1 & 1
                                   ,tls->cipher_suite,tls->client_random,tls->server_name,
                                   negotiated_protocol,&(tls->traffic_protection).enc,
                                   (tls->traffic_protection).enc.secret + 0x20,
                                   (tls->traffic_protection).enc.seq,
                                   (tls->traffic_protection).enc.tls12_enc_record_iv,
                                   &tls->traffic_protection,
                                   (tls->traffic_protection).dec.secret + 0x20,
                                   (tls->traffic_protection).dec.seq);
    }
  }
  return iVar10;
}

Assistant:

int ptls_export(ptls_t *tls, ptls_buffer_t *output)
{
    ptls_iovec_t negotiated_protocol =
        ptls_iovec_init(tls->negotiated_protocol, tls->negotiated_protocol != NULL ? strlen(tls->negotiated_protocol) : 0);
    int ret;

    if (tls->state != PTLS_STATE_SERVER_POST_HANDSHAKE) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    if (ptls_get_protocol_version(tls) == PTLS_PROTOCOL_VERSION_TLS13) {
        export_tls_params(output, tls->is_server, tls->is_psk_handshake, PTLS_PROTOCOL_VERSION_TLS13, tls->cipher_suite,
                          tls->client_random, tls->server_name, negotiated_protocol, {
                              ptls_buffer_pushv(output, tls->traffic_protection.enc.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.enc.seq);
                              ptls_buffer_pushv(output, tls->traffic_protection.dec.secret, tls->cipher_suite->hash->digest_size);
                              ptls_buffer_push64(output, tls->traffic_protection.dec.seq);
                          });
        ret = 0;
    } else {
        if ((ret = export_tls12_params(output, tls->is_server, tls->is_psk_handshake, tls->cipher_suite, tls->client_random,
                                       tls->server_name, negotiated_protocol, tls->traffic_protection.enc.secret,
                                       tls->traffic_protection.enc.secret + PTLS_MAX_SECRET_SIZE, tls->traffic_protection.enc.seq,
                                       tls->traffic_protection.enc.tls12_enc_record_iv, tls->traffic_protection.dec.secret,
                                       tls->traffic_protection.dec.secret + PTLS_MAX_SECRET_SIZE,
                                       tls->traffic_protection.dec.seq)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}